

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O1

void __thiscall cmdline::parser::add(parser *this,string *name,char short_name,string *desc)

{
  pointer *pppoVar1;
  iterator __position;
  const_iterator cVar2;
  option_without_value *this_00;
  mapped_type *ppoVar3;
  cmdline_error *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)cVar2._M_node != &(this->options)._M_t._M_impl.super__Rb_tree_header) {
    this_01 = (cmdline_error *)__cxa_allocate_exception(0x28);
    std::operator+(&bStack_48,"multiple definition: ",name);
    cmdline_error::cmdline_error(this_01,&bStack_48);
    __cxa_throw(this_01,&cmdline_error::typeinfo,cmdline_error::~cmdline_error);
  }
  this_00 = (option_without_value *)operator_new(0x58);
  option_without_value::option_without_value(this_00,name,short_name,desc);
  ppoVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
            ::operator[](&this->options,name);
  *ppoVar3 = (mapped_type)this_00;
  ppoVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
            ::operator[](&this->options,name);
  __position._M_current =
       (this->ordered).
       super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current !=
      (this->ordered).
      super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    *__position._M_current = *ppoVar3;
    pppoVar1 = &(this->ordered).
                super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppoVar1 = *pppoVar1 + 1;
    return;
  }
  std::vector<cmdline::parser::option_base*,std::allocator<cmdline::parser::option_base*>>::
  _M_realloc_insert<cmdline::parser::option_base*const&>
            ((vector<cmdline::parser::option_base*,std::allocator<cmdline::parser::option_base*>> *)
             &this->ordered,__position,ppoVar3);
  return;
}

Assistant:

void add(const std::string &name,
           char short_name=0,
           const std::string &desc=""){
    if (options.count(name)) throw cmdline_error("multiple definition: "+name);
    options[name]=new option_without_value(name, short_name, desc);
    ordered.push_back(options[name]);
  }